

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_maputl.cpp
# Opt level: O2

AActor * P_BlockmapSearch(AActor *mo,int distance,_func_AActor_ptr_AActor_ptr_int_void_ptr *check,
                         void *params)

{
  int iVar1;
  AActor *pAVar2;
  int iVar3;
  int iVar4;
  undefined4 uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  undefined1 auVar13 [16];
  
  iVar11 = (int)(((mo->__Pos).X - bmaporgx) * 0.0078125);
  iVar12 = (int)(((mo->__Pos).Y - bmaporgy) * 0.0078125);
  validcount = validcount + 1;
  if (((-1 < iVar11) &&
      (auVar13._0_4_ = -(uint)(iVar11 < bmapwidth), auVar13._4_4_ = -(uint)(iVar11 < bmapwidth),
      auVar13._8_4_ = -(uint)(iVar12 < bmapheight), auVar13._12_4_ = -(uint)(iVar12 < bmapheight),
      uVar5 = movmskpd(0x9c6104,auVar13), (byte)((byte)uVar5 >> 1 & -1 < iVar12 & (byte)uVar5) == 1)
      ) && (pAVar2 = (*check)(mo,bmapwidth * iVar12 + iVar11,params), pAVar2 != (AActor *)0x0)) {
    return pAVar2;
  }
  if (distance < 1) {
    distance = 0;
  }
  iVar8 = 1;
  do {
    if (iVar8 == distance + 1) {
      return (AActor *)0x0;
    }
    iVar3 = iVar11 - iVar8;
    iVar1 = bmapwidth + -1;
    iVar9 = iVar1;
    if (iVar3 < iVar1) {
      iVar9 = iVar3;
    }
    if (iVar3 < 1) {
      iVar9 = 0;
    }
    iVar6 = iVar12 - iVar8;
    iVar3 = bmapheight + -1;
    iVar4 = iVar3;
    if (iVar6 < iVar3) {
      iVar4 = iVar6;
    }
    if (iVar6 < 1) {
      iVar4 = 0;
    }
    iVar6 = iVar8 + iVar11;
    if ((-1 < iVar6) && (iVar7 = iVar8 + iVar12, -1 < iVar7)) {
      iVar4 = iVar4 * bmapwidth;
      iVar10 = iVar4 + iVar9;
      if (iVar6 < bmapwidth) {
        iVar1 = iVar6;
      }
      if (iVar7 < bmapheight) {
        iVar3 = iVar7;
      }
      iVar3 = iVar3 * bmapwidth;
      for (iVar6 = iVar10; iVar6 <= iVar1 + iVar4; iVar6 = iVar6 + 1) {
        pAVar2 = (*check)(mo,iVar6,params);
        if (pAVar2 != (AActor *)0x0) {
          return pAVar2;
        }
      }
      for (iVar6 = iVar6 + -1; iVar6 <= iVar3 + iVar1; iVar6 = iVar6 + bmapwidth) {
        pAVar2 = (*check)(mo,iVar6,params);
        if (pAVar2 != (AActor *)0x0) {
          return pAVar2;
        }
      }
      for (iVar6 = iVar6 - bmapwidth; iVar9 + iVar3 <= iVar6; iVar6 = iVar6 + -1) {
        pAVar2 = (*check)(mo,iVar6,params);
        if (pAVar2 != (AActor *)0x0) {
          return pAVar2;
        }
      }
      for (iVar6 = iVar6 + 1; iVar10 < iVar6; iVar6 = iVar6 - bmapwidth) {
        pAVar2 = (*check)(mo,iVar6,params);
        if (pAVar2 != (AActor *)0x0) {
          return pAVar2;
        }
      }
    }
    iVar8 = iVar8 + 1;
  } while( true );
}

Assistant:

AActor *P_BlockmapSearch (AActor *mo, int distance, AActor *(*check)(AActor*, int, void *), void *params)
{
	int blockX;
	int blockY;
	int startX, startY;
	int blockIndex;
	int firstStop;
	int secondStop;
	int thirdStop;
	int finalStop;
	int count;
	AActor *target;

	startX = GetBlockX(mo->X());
	startY = GetBlockY(mo->Y());
	validcount++;
	
	if (startX >= 0 && startX < bmapwidth && startY >= 0 && startY < bmapheight)
	{
		if ( (target = check (mo, startY*bmapwidth+startX, params)) )
		{ // found a target right away
			return target;
		}
	}
	for (count = 1; count <= distance; count++)
	{
		blockX = clamp (startX-count, 0, bmapwidth-1);
		blockY = clamp (startY-count, 0, bmapheight-1);

		blockIndex = blockY*bmapwidth+blockX;
		firstStop = startX+count;
		if (firstStop < 0)
		{
			continue;
		}
		if (firstStop >= bmapwidth)
		{
			firstStop = bmapwidth-1;
		}
		secondStop = startY+count;
		if (secondStop < 0)
		{
			continue;
		}
		if (secondStop >= bmapheight)
		{
			secondStop = bmapheight-1;
		}
		thirdStop = secondStop*bmapwidth+blockX;
		secondStop = secondStop*bmapwidth+firstStop;
		firstStop += blockY*bmapwidth;
		finalStop = blockIndex;		

		// Trace the first block section (along the top)
		for (; blockIndex <= firstStop; blockIndex++)
		{
			if ( (target = check (mo, blockIndex, params)) )
			{
				return target;
			}
		}
		// Trace the second block section (right edge)
		for (blockIndex--; blockIndex <= secondStop; blockIndex += bmapwidth)
		{
			if ( (target = check (mo, blockIndex, params)) )
			{
				return target;
			}
		}		
		// Trace the third block section (bottom edge)
		for (blockIndex -= bmapwidth; blockIndex >= thirdStop; blockIndex--)
		{
			if ( (target = check (mo, blockIndex, params)) )
			{
				return target;
			}
		}
		// Trace the final block section (left edge)
		for (blockIndex++; blockIndex > finalStop; blockIndex -= bmapwidth)
		{
			if ( (target = check (mo, blockIndex, params)) )
			{
				return target;
			}
		}
	}
	return NULL;	
}